

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

void __thiscall Kernel::Inference::Inference(Inference *this,GeneratingInferenceMany *gi)

{
  uint uVar1;
  UnitList *pUVar2;
  uint uVar3;
  UnitList **ppUVar4;
  
  initMany(this,gi->rule,gi->premises);
  this->_age = 0;
  uVar3 = 0;
  ppUVar4 = &gi->premises;
  while (pUVar2 = *ppUVar4, pUVar2 != (UnitList *)0x0) {
    uVar1 = (pUVar2->_head->_inference)._age;
    if (uVar3 <= uVar1) {
      uVar3 = uVar1;
    }
    this->_age = uVar3;
    ppUVar4 = &pUVar2->_tail;
  }
  this->_age = uVar3 + 1;
  return;
}

Assistant:

Inference::Inference(const GeneratingInferenceMany& gi) {
  initMany(gi.rule,gi.premises);

  ASS_REP(isGeneratingInferenceRule(gi.rule),ruleName(gi.rule));
  _age = 0;
  UnitList* it= gi.premises;
  while(it) {
    Unit* prem = it->head();
    ASS(prem->isClause());
    _age = std::max(_age,prem->inference().age());
    it=it->tail();
  }
  _age++;
}